

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

HelicsTime helicsDataBufferToTime(HelicsDataBuffer data)

{
  SmallBuffer *this;
  Time val;
  SmallBuffer *ptr;
  Time *in_stack_00000140;
  DataType in_stack_0000014c;
  data_view *in_stack_00000150;
  HelicsDataBuffer in_stack_ffffffffffffffa8;
  SmallBuffer *in_stack_ffffffffffffffb8;
  data_view *in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  this = getBuffer(in_stack_ffffffffffffffa8);
  if (this == (SmallBuffer *)0x0) {
    local_8 = -1.785e+39;
  }
  else {
    helics::data_view::data_view(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    helics::SmallBuffer::data(this);
    helics::detail::detectType((byte *)in_stack_ffffffffffffffb8);
    helics::valueExtract(in_stack_00000150,in_stack_0000014c,in_stack_00000140);
    helics::data_view::~data_view((data_view *)0x1f41ff);
    local_8 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x1f4209);
  }
  return local_8;
}

Assistant:

HelicsTime helicsDataBufferToTime(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return HELICS_TIME_INVALID;
    }
    helics::Time val;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), val);
    return static_cast<HelicsTime>(val);
}